

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

uint32_t fs_ask(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar3 = bits_ask(strm,1);
  uVar4 = 0;
  if (uVar3 != 0) {
    piVar1 = strm->state;
    uVar5 = piVar1->acc;
    iVar6 = piVar1->bitp;
    while (uVar4 = 1, (uVar5 >> ((ulong)(byte)((char)iVar6 - 1) & 0x3f) & 1) == 0) {
      if (iVar6 == 1) {
        if (strm->avail_in == 0) {
          return 0;
        }
        strm->avail_in = strm->avail_in - 1;
        piVar1->acc = uVar5 << 8;
        pbVar2 = strm->next_in;
        strm->next_in = pbVar2 + 1;
        uVar5 = uVar5 << 8 | (ulong)*pbVar2;
        piVar1->acc = uVar5;
        iVar6 = 9;
      }
      piVar1->fs = piVar1->fs + 1;
      iVar6 = iVar6 + -1;
      piVar1->bitp = iVar6;
    }
  }
  return uVar4;
}

Assistant:

static inline uint32_t fs_ask(struct aec_stream *strm)
{
    if (bits_ask(strm, 1) == 0)
        return 0;
    while ((strm->state->acc & (UINT64_C(1) << (strm->state->bitp - 1))) == 0) {
        if (strm->state->bitp == 1) {
            if (strm->avail_in == 0)
                return 0;
            strm->avail_in--;
            strm->state->acc <<= 8;
            strm->state->acc |= *strm->next_in++;
            strm->state->bitp += 8;
        }
        strm->state->fs++;
        strm->state->bitp--;
    }
    return 1;
}